

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STExchange.h
# Opt level: O0

void jbcoin::set<jbcoin::STBlob,jbcoin::Buffer>
               (STObject *st,TypedField<jbcoin::STBlob> *f,Buffer *t)

{
  undefined1 local_30 [8];
  unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> local_28;
  Buffer *local_20;
  Buffer *t_local;
  TypedField<jbcoin::STBlob> *f_local;
  STObject *st_local;
  
  local_20 = t;
  t_local = (Buffer *)f;
  f_local = (TypedField<jbcoin::STBlob> *)st;
  STExchange<jbcoin::STBlob,_jbcoin::Buffer>::set
            ((TypedField<jbcoin::STBlob> *)local_30,(Buffer *)f);
  std::unique_ptr<jbcoin::STBase,std::default_delete<jbcoin::STBase>>::
  unique_ptr<jbcoin::STBlob,std::default_delete<jbcoin::STBlob>,void>
            ((unique_ptr<jbcoin::STBase,std::default_delete<jbcoin::STBase>> *)&local_28,
             (unique_ptr<jbcoin::STBlob,_std::default_delete<jbcoin::STBlob>_> *)local_30);
  STObject::set(st,&local_28);
  std::unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_>::~unique_ptr(&local_28);
  std::unique_ptr<jbcoin::STBlob,_std::default_delete<jbcoin::STBlob>_>::~unique_ptr
            ((unique_ptr<jbcoin::STBlob,_std::default_delete<jbcoin::STBlob>_> *)local_30);
  return;
}

Assistant:

void
set (STObject& st,
    TypedField<U> const& f, T&& t)
{
    st.set(STExchange<U,
        typename std::decay<T>::type>::set(
            f, std::forward<T>(t)));
}